

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

void __thiscall BGIPSolution::SetNrDesiredSolutions(BGIPSolution *this,size_t n)

{
  size_t in_RSI;
  FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  *in_RDI;
  FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  *in_stack_ffffffffffffffb0;
  
  in_RDI->_m_capacity = in_RSI;
  if (in_RDI->_m_capacity == 0x7fffffff) {
    *(undefined1 *)
     &in_RDI[1]._m_l.
      super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = 0;
  }
  else {
    *(undefined1 *)
     &in_RDI[1]._m_l.
      super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = 1;
  }
  if (((ulong)in_RDI[1]._m_l.
              super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
              ._M_impl._M_node.super__List_node_base._M_next & 1) != 0) {
    FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
    ::FixedCapacityPriorityQueue(in_stack_ffffffffffffffb0,(size_t)in_RDI);
    FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
    ::operator=(in_stack_ffffffffffffffb0,in_RDI);
    FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
    ::~FixedCapacityPriorityQueue
              ((FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                *)0x8cf844);
    FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::FixedCapacityPriorityQueue
              ((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)in_stack_ffffffffffffffb0,(size_t)in_RDI);
    FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::operator=((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                 *)in_stack_ffffffffffffffb0,
                (FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                 *)in_RDI);
    FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::~FixedCapacityPriorityQueue
              ((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)0x8cf872);
  }
  return;
}

Assistant:

void BGIPSolution::SetNrDesiredSolutions(size_t n) 
{
    _m_nrDesiredSolutions =  n;
    if(_m_nrDesiredSolutions==INT_MAX)
        _m_useFixedCapacityPriorityQueue=false;
    else
        _m_useFixedCapacityPriorityQueue=true;

    if(_m_useFixedCapacityPriorityQueue)
    {
        _m_qFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair> >(_m_nrDesiredSolutions);
        _m_qpFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair> >(_m_nrDesiredSolutions);
    }
}